

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.cpp
# Opt level: O0

int __thiscall zmq::dist_t::send_to_matching(dist_t *this,msg_t *msg_)

{
  byte bVar1;
  msg_t *in_RSI;
  long in_RDI;
  bool bVar2;
  bool msg_more;
  msg_t *in_stack_00000028;
  dist_t *in_stack_00000030;
  
  bVar1 = msg_t::flags(in_RSI);
  bVar2 = (bVar1 & 1) != 0;
  distribute(in_stack_00000030,in_stack_00000028);
  if (!bVar2) {
    *(undefined8 *)(in_RDI + 0x20) = *(undefined8 *)(in_RDI + 0x28);
  }
  *(bool *)(in_RDI + 0x30) = bVar2;
  return 0;
}

Assistant:

int zmq::dist_t::send_to_matching (msg_t *msg_)
{
    //  Is this end of a multipart message?
    const bool msg_more = (msg_->flags () & msg_t::more) != 0;

    //  Push the message to matching pipes.
    distribute (msg_);

    //  If multipart message is fully sent, activate all the eligible pipes.
    if (!msg_more)
        _active = _eligible;

    _more = msg_more;

    return 0;
}